

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CategoricalMapping::SerializeWithCachedSizes
          (CategoricalMapping *this,CodedOutputStream *output)

{
  bool bVar1;
  int size;
  char *data;
  string *value;
  int64 value_00;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  CategoricalMapping *this_local;
  
  bVar1 = has_stringtoint64map(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&((this->MappingType_).stringtoint64map_)->super_MessageLite,output);
  }
  bVar1 = has_int64tostringmap(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&((this->MappingType_).stringtoint64map_)->super_MessageLite,output);
  }
  bVar1 = has_strvalue(this);
  if (bVar1) {
    strvalue_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    strvalue_abi_cxx11_(this);
    size = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (data,size,SERIALIZE,"CoreML.Specification.CategoricalMapping.strValue");
    value = strvalue_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0x65,value,output);
  }
  bVar1 = has_int64value(this);
  if (bVar1) {
    value_00 = int64value(this);
    google::protobuf::internal::WireFormatLite::WriteInt64(0x66,value_00,output);
  }
  return;
}

Assistant:

void CategoricalMapping::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.CategoricalMapping)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.StringToInt64Map stringToInt64Map = 1;
  if (has_stringtoint64map()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *MappingType_.stringtoint64map_, output);
  }

  // .CoreML.Specification.Int64ToStringMap int64ToStringMap = 2;
  if (has_int64tostringmap()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *MappingType_.int64tostringmap_, output);
  }

  // string strValue = 101;
  if (has_strvalue()) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->strvalue().data(), this->strvalue().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.CategoricalMapping.strValue");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      101, this->strvalue(), output);
  }

  // int64 int64Value = 102;
  if (has_int64value()) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(102, this->int64value(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.CategoricalMapping)
}